

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_31::HttpClientAdapter::ResponseImpl::send
          (ResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  PromiseNode **ppPVar1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  PromiseFulfiller<kj::HttpClient::Response> *pPVar4;
  char *pcVar5;
  size_t sVar6;
  AsyncInputStream *pAVar7;
  HttpHeaderTable *pHVar8;
  ArrayDisposer *pAVar9;
  RemoveConst<kj::HttpHeaders::Header> *pRVar10;
  TransformPromiseNodeBase *this_00;
  ResponseImpl *pRVar11;
  _func_int **pp_Var12;
  int __flags_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  undefined4 in_register_00000034;
  ResponseImpl *pRVar14;
  StringPtr *pSVar15;
  undefined4 in_register_00000084;
  void *pvVar16;
  void *__arg;
  __fn *in_R9;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar17;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>_>_>
  OVar18;
  char *in_stack_00000008;
  Own<kj::HttpHeaders> headersCopy;
  String statusTextCopy;
  OneWayPipe pipe;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl> local_108;
  RemoveConst<kj::HttpHeaders::Header> *local_f8;
  Header *pHStack_f0;
  String local_e8;
  Own<kj::_::PromiseNode> local_d0;
  OneWayPipe local_c0;
  HttpHeaders local_a0;
  Maybe<unsigned_long> local_40;
  size_t sVar13;
  
  pvVar16 = (void *)CONCAT44(in_register_00000084,__flags);
  pRVar14 = (ResponseImpl *)CONCAT44(in_register_00000034,__fd);
  sVar13 = __n;
  __arg = pvVar16;
  heapString(&local_e8,(long)pvVar16 - 1);
  __flags_00 = (int)sVar13;
  __child_stack = extraout_RDX;
  if ((long)pvVar16 - 1U != 0) {
    pSVar15 = (StringPtr *)local_e8.content.size_;
    if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
      pSVar15 = (StringPtr *)local_e8.content.ptr;
    }
    memcpy(pSVar15,(void *)__n,(long)pvVar16 - 1U);
    __child_stack = extraout_RDX_00;
  }
  HttpHeaders::clone(&local_a0,in_R9,__child_stack,__flags_00,__arg);
  heap<kj::HttpHeaders>((kj *)&local_f8,&local_a0);
  HttpHeaders::~HttpHeaders(&local_a0);
  if (*(int *)((long)&((Own<kj::_::PromiseNode> *)&pRVar14->super_Refcounted)->ptr + 4) == 1) {
LAB_002f0fb6:
    local_a0.indexedHeaders.ptr =
         (StringPtr *)CONCAT44(local_a0.indexedHeaders.ptr._4_4_,(int)__buf);
    local_a0.indexedHeaders.size_ = (size_t)local_e8.content.ptr;
    local_a0.indexedHeaders.disposer = (ArrayDisposer *)local_e8.content.size_;
    local_a0.unindexedHeaders.builder.ptr = (Header *)local_e8.content.disposer;
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    local_a0.unindexedHeaders.builder.pos = local_f8;
    local_a0.unindexedHeaders.builder.endPtr = pHStack_f0;
    pHStack_f0 = (Header *)0x0;
    local_a0.unindexedHeaders.builder.disposer._0_1_ = *in_stack_00000008;
    if ((char)local_a0.unindexedHeaders.builder.disposer == '\x01') {
      local_a0.ownedStrings.builder.ptr = *(Array<char> **)(in_stack_00000008 + 8);
    }
    local_a0.table = (HttpHeaderTable *)pRVar14;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x70);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&pRVar14->task,
               _::
               TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4311:26),_kj::_::PropagateException>
               ::anon_class_72_5_009bee8d_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00462a70;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_a0.table;
    *(undefined4 *)&this_00[1].dependency.disposer = local_a0.indexedHeaders.ptr._0_4_;
    this_00[1].dependency.ptr = (PromiseNode *)local_a0.indexedHeaders.size_;
    this_00[1].continuationTracePtr = local_a0.indexedHeaders.disposer;
    this_00[2].super_PromiseNode._vptr_PromiseNode =
         (_func_int **)local_a0.unindexedHeaders.builder.ptr;
    local_a0.indexedHeaders.size_ = 0;
    local_a0.indexedHeaders.disposer = (ArrayDisposer *)0x0;
    this_00[2].dependency.disposer = (Disposer *)local_a0.unindexedHeaders.builder.pos;
    this_00[2].dependency.ptr = (PromiseNode *)local_a0.unindexedHeaders.builder.endPtr;
    local_a0.unindexedHeaders.builder.endPtr = (Header *)0x0;
    *(char *)&this_00[2].continuationTracePtr = (char)local_a0.unindexedHeaders.builder.disposer;
    if ((char)local_a0.unindexedHeaders.builder.disposer == '\x01') {
      this_00[3].super_PromiseNode._vptr_PromiseNode =
           (_func_int **)local_a0.ownedStrings.builder.ptr;
    }
    local_d0.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_d0.ptr = (PromiseNode *)this_00;
    pRVar11 = (ResponseImpl *)operator_new(0x28);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pRVar11,&local_d0,_::IdentityFunc<void>::operator());
    ((PromiseNode *)&pRVar11->super_Response)->_vptr_PromiseNode =
         (_func_int **)&PTR_onReady_00462be0;
    local_108.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::_::IdentityFunc<void>,kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Exception&&)#1}>>
          ::instance;
    local_108.ptr = pRVar11;
    OVar17 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                       ((kj *)&local_c0,(Own<kj::_::PromiseNode> *)&local_108);
    pAVar7 = local_c0.in.ptr;
    pRVar11 = local_108.ptr;
    if (local_108.ptr != (ResponseImpl *)0x0) {
      local_108.ptr = (ResponseImpl *)0x0;
      (*(code *)((Disposer *)(local_108.disposer)->_vptr_Disposer)->_vptr_Disposer)
                (local_108.disposer,
                 ((PromiseNode *)&pRVar11->super_Response)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pRVar11->super_Response)->_vptr_PromiseNode,OVar17.ptr);
    }
    pDVar2 = (pRVar14->task).super_PromiseBase.node.disposer;
    pPVar3 = (pRVar14->task).super_PromiseBase.node.ptr;
    (pRVar14->task).super_PromiseBase.node.disposer = local_c0.in.disposer;
    (pRVar14->task).super_PromiseBase.node.ptr = (PromiseNode *)pAVar7;
    if (pPVar3 != (PromiseNode *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
    }
    pPVar3 = local_d0.ptr;
    if ((TransformPromiseNodeBase *)local_d0.ptr != (TransformPromiseNodeBase *)0x0) {
      local_d0.ptr = (PromiseNode *)0x0;
      (**(local_d0.disposer)->_vptr_Disposer)
                (local_d0.disposer,
                 ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
    }
    if (local_a0.unindexedHeaders.builder.endPtr != (Header *)0x0) {
      local_a0.unindexedHeaders.builder.endPtr = (Header *)0x0;
      (**(_func_int **)((local_a0.unindexedHeaders.builder.pos)->name).content.ptr)();
    }
    pAVar9 = local_a0.indexedHeaders.disposer;
    sVar6 = local_a0.indexedHeaders.size_;
    if ((char *)local_a0.indexedHeaders.size_ != (char *)0x0) {
      local_a0.indexedHeaders.size_ = 0;
      local_a0.indexedHeaders.disposer = (ArrayDisposer *)0x0;
      (**(_func_int **)((local_a0.unindexedHeaders.builder.ptr)->name).content.ptr)
                (local_a0.unindexedHeaders.builder.ptr,sVar6,1,pAVar9,pAVar9,0);
    }
    pp_Var12 = (_func_int **)operator_new(8);
    *pp_Var12 = (_func_int *)&PTR_write_00462c68;
    (this->super_Response)._vptr_Response =
         (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::NullOutputStream>::instance;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var12;
  }
  else {
    if (*in_stack_00000008 == '\x01') {
      if (*(long *)(in_stack_00000008 + 8) == 0) goto LAB_002f0fb6;
      local_40.ptr.field_1 =
           *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(in_stack_00000008 + 8);
    }
    local_40.ptr.isSet = (bool)*in_stack_00000008;
    newOneWayPipe(&local_c0,&local_40);
    ppPVar1 = &((Own<kj::_::PromiseNode> *)&pRVar14->super_Refcounted)->ptr;
    *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
    local_108.disposer = &(pRVar14->super_Refcounted).super_Disposer;
    local_108.ptr = pRVar14;
    OVar18 = heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl>>
                       ((kj *)&local_a0,(Own<kj::_::PromiseNode> *)&pRVar14->task,&local_108);
    pSVar15 = local_a0.indexedHeaders.ptr;
    pHVar8 = local_a0.table;
    pRVar11 = local_108.ptr;
    local_a0.indexedHeaders.ptr = (StringPtr *)0x0;
    if (local_108.ptr != (ResponseImpl *)0x0) {
      local_108.ptr = (ResponseImpl *)0x0;
      (*(code *)((Disposer *)(local_108.disposer)->_vptr_Disposer)->_vptr_Disposer)
                (local_108.disposer,
                 ((PromiseNode *)&pRVar11->super_Response)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pRVar11->super_Response)->_vptr_PromiseNode,OVar18.ptr);
    }
    local_a0.unindexedHeaders.builder.pos =
         (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x30);
    pAVar7 = local_c0.in.ptr;
    local_c0.in.ptr = (AsyncInputStream *)0x0;
    ((local_a0.unindexedHeaders.builder.pos)->name).content.ptr = (char *)&PTR_read_00462ce8;
    ((local_a0.unindexedHeaders.builder.pos)->name).content.size_ = (size_t)local_c0.in.disposer;
    ((local_a0.unindexedHeaders.builder.pos)->value).content.ptr = (char *)pAVar7;
    *(undefined1 *)&((local_a0.unindexedHeaders.builder.pos)->value).content.size_ = 1;
    local_a0.unindexedHeaders.builder.pos[1].name.content.ptr = (char *)pHVar8;
    local_a0.unindexedHeaders.builder.pos[1].name.content.size_ = (size_t)pSVar15;
    pPVar4 = (pRVar14->fulfiller).ptr;
    local_a0.table = (HttpHeaderTable *)CONCAT44(local_a0.table._4_4_,(int)__buf);
    local_a0.indexedHeaders.ptr = (StringPtr *)0x385fb3;
    if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
      local_a0.indexedHeaders.ptr = (StringPtr *)local_e8.content.ptr;
    }
    local_a0.indexedHeaders.size_ =
         (long)&((ArrayPtr<const_char> *)local_e8.content.size_)->ptr +
         (ulong)((StringPtr *)local_e8.content.size_ == (StringPtr *)0x0);
    local_a0.indexedHeaders.disposer = (ArrayDisposer *)pHStack_f0;
    local_a0.unindexedHeaders.builder.ptr = (Header *)operator_new(0x40);
    ((local_a0.unindexedHeaders.builder.ptr)->name).content.ptr =
         (char *)&PTR___cxa_pure_virtual_00453a18;
    ((local_a0.unindexedHeaders.builder.ptr)->name).content.size_ = (size_t)local_f8;
    ((local_a0.unindexedHeaders.builder.ptr)->value).content.ptr = (char *)pHStack_f0;
    pHStack_f0 = (Header *)0x0;
    ((local_a0.unindexedHeaders.builder.ptr)->value).content.size_ = (size_t)local_e8.content.ptr;
    local_a0.unindexedHeaders.builder.ptr[1].name.content.ptr = (char *)local_e8.content.size_;
    local_a0.unindexedHeaders.builder.ptr[1].name.content.size_ = (size_t)local_e8.content.disposer;
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    local_a0.unindexedHeaders.builder.ptr[1].value.content.ptr = "P/F";
    local_a0.unindexedHeaders.builder.ptr[1].value.content.size_ =
         (size_t)local_a0.unindexedHeaders.builder.pos;
    ((local_a0.unindexedHeaders.builder.ptr)->name).content.ptr = (char *)&PTR_disposeImpl_00463008;
    (**pPVar4->_vptr_PromiseFulfiller)(pPVar4);
    pRVar10 = local_a0.unindexedHeaders.builder.pos;
    if (local_a0.unindexedHeaders.builder.pos != (RemoveConst<kj::HttpHeaders::Header> *)0x0) {
      local_a0.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
      (**(_func_int **)((local_a0.unindexedHeaders.builder.ptr)->name).content.ptr)
                (local_a0.unindexedHeaders.builder.ptr,
                 *(_func_int **)((long)(pRVar10->name).content.ptr + -0x10) +
                 (long)&(pRVar10->name).content);
    }
    pAVar7 = local_c0.in.ptr;
    (this->super_Response)._vptr_Response = (_func_int **)local_c0.out.disposer;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_c0.out.ptr;
    local_c0.out.ptr = (AsyncOutputStream *)0x0;
    if (local_c0.in.ptr != (AsyncInputStream *)0x0) {
      local_c0.in.ptr = (AsyncInputStream *)0x0;
      (**(local_c0.in.disposer)->_vptr_Disposer)
                (local_c0.in.disposer,
                 pAVar7->_vptr_AsyncInputStream[-2] + (long)&pAVar7->_vptr_AsyncInputStream);
    }
  }
  if (pHStack_f0 != (Header *)0x0) {
    pHStack_f0 = (Header *)0x0;
    (**(_func_int **)(local_f8->name).content.ptr)();
  }
  sVar6 = local_e8.content.size_;
  pcVar5 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (**(_func_int **)(((StringPtr *)&(local_e8.content.disposer)->_vptr_ArrayDisposer)->content).ptr
    )(local_e8.content.disposer,pcVar5,1,sVar6,sVar6,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (method == kj::HttpMethod::HEAD || expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::heap<NullInputStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<NullOutputStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        auto wrapper = kj::heap<DelayedEofInputStream>(
            kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }